

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode error_unencode_write(Curl_easy *data,contenc_writer *writer,char *buf,size_t nbytes)

{
  char *pcVar1;
  char *all;
  size_t nbytes_local;
  char *buf_local;
  contenc_writer *writer_local;
  Curl_easy *data_local;
  
  pcVar1 = Curl_all_content_encodings();
  if (pcVar1 == (char *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    Curl_failf(data,"Unrecognized content encoding type. libcurl understands %s content encodings.",
               pcVar1);
    (*Curl_cfree)(pcVar1);
    data_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode error_unencode_write(struct Curl_easy *data,
                                     struct contenc_writer *writer,
                                     const char *buf, size_t nbytes)
{
  char *all = Curl_all_content_encodings();

  (void) writer;
  (void) buf;
  (void) nbytes;

  if(!all)
    return CURLE_OUT_OF_MEMORY;
  failf(data, "Unrecognized content encoding type. "
        "libcurl understands %s content encodings.", all);
  free(all);
  return CURLE_BAD_CONTENT_ENCODING;
}